

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

String * __thiscall
kj::InputStream::readAllText(String *__return_storage_ptr__,InputStream *this,uint64_t limit)

{
  uchar *puVar1;
  size_t sVar2;
  Array<unsigned_char> local_28;
  
  anon_unknown_75::readAll(&local_28,this,limit,true);
  sVar2 = local_28.size_;
  puVar1 = local_28.ptr;
  if (local_28.disposer == (ArrayDisposer *)0x0) {
    (__return_storage_ptr__->content).ptr = (char *)0x0;
    (__return_storage_ptr__->content).size_ = 0;
    (__return_storage_ptr__->content).disposer = (ArrayDisposer *)0x0;
    if (local_28.ptr != (uchar *)0x0) {
      local_28.ptr = (uchar *)0x0;
      local_28.size_ = 0;
      (*(code *)*puRam0000000000000000)(0,puVar1,1,sVar2,sVar2,0);
    }
  }
  else {
    (__return_storage_ptr__->content).ptr = (char *)local_28.ptr;
    (__return_storage_ptr__->content).size_ = local_28.size_;
    (__return_storage_ptr__->content).disposer = local_28.disposer;
  }
  return __return_storage_ptr__;
}

Assistant:

String InputStream::readAllText(uint64_t limit) {
  return String(readAll(*this, limit, true).releaseAsChars());
}